

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O1

LinkageStatus * __thiscall
gl3cts::ClipDistance::Utility::Program::linkShaders
          (LinkageStatus *__return_storage_ptr__,Program *this,CompilationStatus *vertex_shader,
          CompilationStatus *fragment_shader,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transform_feedback_varyings)

{
  GLint *pGVar1;
  char *pcVar2;
  GLint GVar3;
  CompilationStatus *pCVar4;
  GLuint GVar5;
  GLenum GVar6;
  deUint32 err;
  char *__s;
  pointer pbVar7;
  ulong __n;
  GLint log_size;
  GLchar *varying;
  GLint local_54;
  CompilationStatus *local_50;
  CompilationStatus *local_48;
  string *local_40;
  pointer local_38;
  
  __return_storage_ptr__->program_id = 0;
  __return_storage_ptr__->program_linkage_status = 0;
  local_40 = &__return_storage_ptr__->program_linkage_log;
  (__return_storage_ptr__->program_linkage_log)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->program_linkage_log).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,0x1b32ab9);
  if ((vertex_shader->shader_id != 0) && (fragment_shader->shader_id != 0)) {
    local_50 = vertex_shader;
    GVar5 = (*this->m_gl->createProgram)();
    __return_storage_ptr__->program_id = GVar5;
    GVar6 = (*this->m_gl->getError)();
    glu::checkError(GVar6,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x54f);
    if (__return_storage_ptr__->program_id != 0) {
      pbVar7 = (transform_feedback_varyings->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_48 = fragment_shader;
      if (pbVar7 != (transform_feedback_varyings->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_38 = (pbVar7->_M_dataplus)._M_p;
          (*this->m_gl->transformFeedbackVaryings)
                    (__return_storage_ptr__->program_id,1,&local_38,0x8c8c);
          GVar6 = (*this->m_gl->getError)();
          glu::checkError(GVar6,"glTransformFeedbackVaryings() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                          ,0x55b);
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != (transform_feedback_varyings->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      }
      (*this->m_gl->attachShader)(__return_storage_ptr__->program_id,local_50->shader_id);
      pCVar4 = local_48;
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x561);
      (*this->m_gl->attachShader)(__return_storage_ptr__->program_id,pCVar4->shader_id);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x565);
      (*this->m_gl->linkProgram)(__return_storage_ptr__->program_id);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x569);
      pGVar1 = &__return_storage_ptr__->program_linkage_status;
      (*this->m_gl->getProgramiv)(__return_storage_ptr__->program_id,0x8b82,pGVar1);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x56e);
      if (*pGVar1 == 0) {
        local_54 = 0;
        (*this->m_gl->getProgramiv)(__return_storage_ptr__->program_id,0x8b84,&local_54);
        GVar6 = (*this->m_gl->getError)();
        glu::checkError(GVar6,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                        ,0x577);
        GVar3 = local_54;
        __n = (ulong)local_54;
        if (__n != 0) {
          __s = (char *)operator_new__(__n);
          memset(__s,0,__n);
          (*this->m_gl->getProgramInfoLog)
                    (__return_storage_ptr__->program_id,GVar3,(GLsizei *)0x0,__s);
          pcVar2 = (char *)(__return_storage_ptr__->program_linkage_log)._M_string_length;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)local_40,0,pcVar2,(ulong)__s);
          operator_delete__(__s);
          err = (*this->m_gl->getError)();
          glu::checkError(err,"glGetProgramInfoLog() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                          ,0x587);
        }
      }
      (*this->m_gl->detachShader)(__return_storage_ptr__->program_id,local_50->shader_id);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glDetachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x58f);
      (*this->m_gl->detachShader)(__return_storage_ptr__->program_id,pCVar4->shader_id);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glDetachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x593);
      if (*pGVar1 == 0) {
        (*this->m_gl->deleteProgram)(__return_storage_ptr__->program_id);
        __return_storage_ptr__->program_id = 0;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::LinkageStatus gl3cts::ClipDistance::Utility::Program::linkShaders(
	const CompilationStatus& vertex_shader, const CompilationStatus& fragment_shader,
	std::vector<std::string>& transform_feedback_varyings)
{
	LinkageStatus program = { 0, GL_NONE, "" };

	if (vertex_shader.shader_id && fragment_shader.shader_id)
	{
		try
		{
			/* Creation */
			program.program_id = m_gl.createProgram();

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateShader() call failed.");

			if (program.program_id)
			{
				/* Transform Feedback setup */
				for (std::vector<std::string>::iterator i = transform_feedback_varyings.begin();
					 i != transform_feedback_varyings.end(); ++i)
				{
					const glw::GLchar* varying = i->c_str();

					m_gl.transformFeedbackVaryings(program.program_id, 1, &varying, GL_INTERLEAVED_ATTRIBS);

					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTransformFeedbackVaryings() call failed.");
				}

				/* Linking */
				m_gl.attachShader(program.program_id, vertex_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glAttachShader() call failed.");

				m_gl.attachShader(program.program_id, fragment_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glAttachShader() call failed.");

				m_gl.linkProgram(program.program_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glLinkProgram() call failed.");

				/* Status query */
				m_gl.getProgramiv(program.program_id, GL_LINK_STATUS, &program.program_linkage_status);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetProgramiv() call failed.");

				/* Logging */
				if (program.program_linkage_status == GL_FALSE)
				{
					glw::GLint log_size = 0;

					m_gl.getProgramiv(program.program_id, GL_INFO_LOG_LENGTH, &log_size);

					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetProgramiv() call failed.");

					if (log_size)
					{
						glw::GLchar* log = new glw::GLchar[log_size];

						if (log)
						{
							memset(log, 0, log_size);

							m_gl.getProgramInfoLog(program.program_id, log_size, DE_NULL, log);

							program.program_linkage_log = log;

							delete[] log;

							GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetProgramInfoLog() call failed.");
						}
					}
				}

				/* Cleanup */
				m_gl.detachShader(program.program_id, vertex_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDetachShader() call failed.");

				m_gl.detachShader(program.program_id, fragment_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDetachShader() call failed.");

				if (program.program_linkage_status == GL_FALSE)
				{
					m_gl.deleteProgram(program.program_id);

					program.program_id = 0;
				}
			}
		}
		catch (...)
		{
			if (program.program_id)
			{
				m_gl.deleteProgram(program.program_id);

				program.program_id = 0;
			}
		}
	}

	return program;
}